

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# some_types.h
# Opt level: O1

void hiberlite::
     hibernate<hiberlite::AVisitor<hiberlite::KillChildren>,std::vector<int,std::allocator<int>>>
               (AVisitor<hiberlite::KillChildren> *ar,
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               *v,uint param_3)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  collection_nvp<std::vector<int,_std::allocator<int>_>,_hiberlite::stl_stream_adapter<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
  body;
  string local_f8;
  collection_nvp<std::vector<int,_std::allocator<int>_>,_hiberlite::stl_stream_adapter<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
  local_d8;
  collection_nvp<std::vector<int,_std::allocator<int>_>,_hiberlite::stl_stream_adapter<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
  local_90;
  stl_stream_adapter<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
  local_48;
  
  local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"items","");
  local_48.xx.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  local_48.xx.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_48.xx.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_48.it._M_current =
       (v->
       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
       )._M_impl.super__Vector_impl_data._M_start;
  local_48.ct = v;
  collection_nvp<std::vector<int,_std::allocator<int>_>,_hiberlite::stl_stream_adapter<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
  ::collection_nvp(&local_90,&local_f8,&local_48);
  if (local_48.xx.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_48.xx.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
    operator_delete(local_f8._M_dataplus._M_p);
  }
  paVar1 = &local_d8.name.field_2;
  local_d8.name._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_d8,local_90.name._M_dataplus._M_p,
             local_90.name._M_dataplus._M_p + local_90.name._M_string_length);
  local_d8.stream.ct = local_90.stream.ct;
  local_d8.stream.it._M_current = local_90.stream.it._M_current;
  std::vector<int,_std::allocator<int>_>::vector(&local_d8.stream.xx,&local_90.stream.xx);
  AVisitor<hiberlite::KillChildren>::operator&(ar,&local_d8);
  if (local_d8.stream.xx.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_d8.stream.xx.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8.name._M_dataplus._M_p != paVar1) {
    operator_delete(local_d8.name._M_dataplus._M_p);
  }
  if (local_90.stream.xx.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_90.stream.xx.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.name._M_dataplus._M_p != &local_90.name.field_2) {
    operator_delete(local_90.name._M_dataplus._M_p);
  }
  return;
}

Assistant:

void hibernate(A& ar, std::vector<E>& v, const unsigned int)
{
	collection_nvp<E,stl_stream_adapter<E,std::vector<E> > > body( "items", stl_stream_adapter<E,std::vector<E> >(v) );
	ar & body;
}